

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ztimer::TimerManager::TimePointValid
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,TimerManager *this,
          string *timePoint)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  int *piVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  regex rule;
  undefined1 local_88 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  int *local_60;
  pointer local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  if (timePoint->_M_string_length != 0x13) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,
             "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$"
             ,0x10);
  __s._M_current = (timePoint->_M_dataplus)._M_p;
  local_88._16_8_ = (pointer)0x0;
  _Stack_70._M_current = (char *)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + timePoint->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_88,&local_50,0);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!bVar3) {
LAB_0011c5ef:
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
    return __return_storage_ptr__;
  }
  local_60 = (int *)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = local_60;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_60 + 6;
  local_60[0] = 0;
  local_60[1] = 0;
  local_60[2] = 0;
  local_60[3] = 0;
  local_60[4] = 0;
  local_60[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = local_60 + 6;
  std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
  uVar6 = local_88._0_8_;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)uVar6,(char **)&local_58,10);
  if (local_58 == (pointer)uVar6) {
    std::__throw_invalid_argument("stoi");
LAB_0011c628:
    std::__throw_out_of_range("stoi");
LAB_0011c634:
    std::__throw_invalid_argument("stoi");
LAB_0011c640:
    std::__throw_out_of_range("stoi");
LAB_0011c64c:
    std::__throw_invalid_argument("stoi");
LAB_0011c658:
    std::__throw_out_of_range("stoi");
LAB_0011c664:
    std::__throw_invalid_argument("stoi");
LAB_0011c670:
    std::__throw_out_of_range("stoi");
LAB_0011c67c:
    std::__throw_invalid_argument("stoi");
LAB_0011c688:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_0011c628;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    *local_60 = (int)lVar5;
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_88._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
    uVar6 = local_88._0_8_;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)local_88._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar6) goto LAB_0011c634;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0011c640;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_60[1] = (int)lVar5;
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_88._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
    uVar6 = local_88._0_8_;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)local_88._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar6) goto LAB_0011c64c;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0011c658;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_60[2] = (int)lVar5;
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_88._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
    uVar6 = local_88._0_8_;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)local_88._0_8_,(char **)&local_58,10);
    if (local_58 == (pointer)uVar6) goto LAB_0011c664;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0011c670;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_60[3] = (int)lVar5;
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_88._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
    uVar6 = local_88._0_8_;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)local_88._0_8_,(char **)&local_58,10);
    piVar2 = local_60;
    if (local_58 == (pointer)uVar6) goto LAB_0011c67c;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0011c688;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    local_60[4] = (int)lVar5;
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_88._16_8_)->first)._M_current + 1));
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)timePoint);
    uVar6 = local_88._0_8_;
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)local_88._0_8_,(char **)&local_58,10);
    if (local_58 != (pointer)uVar6) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        piVar2[5] = (int)lVar5;
        if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,
                          (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_88._16_8_)->first)._M_current + 1));
        }
        goto LAB_0011c5ef;
      }
      goto LAB_0011c6a0;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011c6a0:
  uVar6 = std::__throw_out_of_range("stoi");
  operator_delete(local_60,0x18);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  _Unwind_Resume(uVar6);
}

Assistant:

std::vector<int> TimerManager::TimePointValid(const std::string& timePoint)
    {
        // 合法的系统时间点： char timePoint[20] = "xxxx-xx-xx xx:xx:xx";
        if (timePoint.size() != 19) {
            return {};
        }
        std::regex rule(
            "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$");
        if (regex_match(timePoint, rule) == false) {
            return {};
        }
        std::vector<int> ans(6);
        ans[0] = std::stoi(timePoint.substr(0, 4));   // year
        ans[1] = std::stoi(timePoint.substr(5, 2));   // month
        ans[2] = std::stoi(timePoint.substr(8, 2));   // day
        ans[3] = std::stoi(timePoint.substr(11, 2));  // hour
        ans[4] = std::stoi(timePoint.substr(14, 2));  // minute
        ans[5] = std::stoi(timePoint.substr(17, 2));  // second
        return ans;
    }